

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O2

void __thiscall cs222::Pass2::writeObjectProgram(Pass2 *this,string *progName,string *progLength)

{
  deque<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  _Elt_pointer puVar1;
  value_type vVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  runtime_error *this_02;
  _Elt_pointer puVar7;
  _Elt_pointer pbVar8;
  ulong uVar9;
  _Elt_pointer pbVar10;
  _Map_pointer ppbVar11;
  size_type __n;
  string temp;
  string textRecLength;
  _Map_pointer local_418;
  _Elt_pointer local_410;
  string textRec;
  string headerRecord;
  string objProgPath;
  string endRecord;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modRecords;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  textRecords;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coAdd;
  ofstream ofs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  byte abStack_250 [8];
  uint auStack_248 [118];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&objProgPath,&this->srcFileName,".objprog");
  headerRecord._M_dataplus._M_p = (pointer)&headerRecord.field_2;
  headerRecord._M_string_length = 0;
  headerRecord.field_2._M_local_buf[0] = '\0';
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&textRecords.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&modRecords.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  endRecord._M_dataplus._M_p = (pointer)&endRecord.field_2;
  endRecord._M_string_length = 0;
  endRecord.field_2._M_local_buf[0] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,"H",
                 progName);
  std::__cxx11::string::operator=((string *)&headerRecord,(string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  while (headerRecord._M_string_length < 7) {
    std::__cxx11::string::append((char *)&headerRecord);
  }
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&coAdd.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  this_00 = &this->correspondingAddresses;
  uVar9 = 0;
  while( true ) {
    sVar3 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size(this_00);
    if (sVar3 <= uVar9) break;
    std::__cxx11::stringstream::stringstream((stringstream *)&ofs);
    std::__cxx11::string::string((string *)&temp,"",(allocator *)&textRecLength);
    *(uint *)((long)auStack_248 + *(long *)(local_260._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_248 + *(long *)(local_260._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
              (&(this->correspondingAddresses).
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_start,uVar9);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_260);
    std::operator>>((istream *)&ofs,(string *)&temp);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&coAdd,&temp);
    while( true ) {
      pvVar4 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&coAdd,uVar9);
      if (5 < pvVar4->_M_string_length) break;
      pvVar4 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&coAdd,uVar9);
      std::operator+(&textRecLength,"0",pvVar4);
      pvVar4 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&coAdd,uVar9);
      std::__cxx11::string::operator=((string *)pvVar4,(string *)&textRecLength);
      std::__cxx11::string::~string((string *)&textRecLength);
    }
    std::__cxx11::string::~string((string *)&temp);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ofs);
    uVar9 = uVar9 + 1;
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::at(&coAdd,0);
  std::__cxx11::string::append((string *)&headerRecord);
  while (progLength->_M_string_length < 6) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,"0",
                   progLength);
    std::__cxx11::string::operator=((string *)progLength,(string *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
  }
  std::__cxx11::string::append((string *)&headerRecord);
  puVar7 = (this->modificationAddresses).
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_410 = (this->modificationAddresses).
              super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
  local_418 = (this->modificationAddresses).
              super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
  puVar1 = (this->modificationAddresses).
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  while (puVar7 != puVar1) {
    std::__cxx11::string::string((string *)&temp,"",(allocator *)&ofs);
    std::__cxx11::stringstream::stringstream((stringstream *)&ofs);
    *(uint *)((long)auStack_248 + *(long *)(local_260._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_248 + *(long *)(local_260._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_260);
    std::operator>>((istream *)&ofs,(string *)&temp);
    while (temp._M_string_length < 6) {
      std::operator+(&textRecLength,"0",&temp);
      std::__cxx11::string::operator=((string *)&temp,(string *)&textRecLength);
      std::__cxx11::string::~string((string *)&textRecLength);
    }
    std::operator+(&textRec,"M",&temp);
    std::operator+(&textRecLength,&textRec,"05");
    std::__cxx11::string::operator=((string *)&temp,(string *)&textRecLength);
    std::__cxx11::string::~string((string *)&textRecLength);
    std::__cxx11::string::~string((string *)&textRec);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&modRecords,&temp);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ofs);
    std::__cxx11::string::~string((string *)&temp);
    puVar7 = puVar7 + 1;
    if (puVar7 == local_410) {
      puVar7 = local_418[1];
      local_418 = local_418 + 1;
      local_410 = puVar7 + 0x40;
    }
  }
  pvVar4 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&coAdd,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,"E",
                 pvVar4);
  std::__cxx11::string::operator=((string *)&endRecord,(string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  this_01 = &this->objectCode;
  uVar9 = 0;
  do {
    __n = (size_type)(int)uVar9;
    sVar3 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this_01);
    if (sVar3 <= __n) {
      std::ofstream::ofstream(&ofs,(string *)&objProgPath,_S_out);
      if ((abStack_250[*(long *)(_ofs + -0x18)] & 5) == 0) {
        std::operator+(&temp,"Writing object program to ",&objProgPath);
        logDebug(&temp);
        std::__cxx11::string::~string((string *)&temp);
        *(uint *)(abStack_250 + *(long *)(_ofs + -0x18) + -8) =
             *(uint *)(abStack_250 + *(long *)(_ofs + -0x18) + -8) | 0x20;
        poVar6 = std::operator<<((ostream *)&ofs,(string *)&headerRecord);
        std::endl<char,std::char_traits<char>>(poVar6);
        pbVar8 = textRecords.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pbVar10 = textRecords.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppbVar11 = textRecords.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        while (pbVar8 != textRecords.
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          std::__cxx11::string::string((string *)&temp,(string *)pbVar8);
          poVar6 = std::operator<<((ostream *)&ofs,(string *)&temp);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&temp);
          pbVar8 = pbVar8 + 1;
          if (pbVar8 == pbVar10) {
            pbVar8 = ppbVar11[1];
            ppbVar11 = ppbVar11 + 1;
            pbVar10 = pbVar8 + 0x10;
          }
        }
        pbVar8 = modRecords.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pbVar10 = modRecords.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppbVar11 = modRecords.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        while (pbVar8 != modRecords.
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          std::__cxx11::string::string((string *)&temp,(string *)pbVar8);
          poVar6 = std::operator<<((ostream *)&ofs,(string *)&temp);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&temp);
          pbVar8 = pbVar8 + 1;
          if (pbVar8 == pbVar10) {
            pbVar8 = ppbVar11[1];
            ppbVar11 = ppbVar11 + 1;
            pbVar10 = pbVar8 + 0x10;
          }
        }
        poVar6 = std::operator<<((ostream *)&ofs,(string *)&endRecord);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::ofstream::close();
        std::ofstream::~ofstream(&ofs);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque(&coAdd);
        std::__cxx11::string::~string((string *)&endRecord);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque(&modRecords);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque(&textRecords);
        std::__cxx11::string::~string((string *)&headerRecord);
        std::__cxx11::string::~string((string *)&objProgPath);
        return;
      }
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&textRecLength,"Cannot open file: ",(allocator *)&textRec);
      std::operator+(&temp,&textRecLength,&objProgPath);
      std::runtime_error::runtime_error(this_02,(string *)&temp);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar4 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&coAdd,__n);
    std::__cxx11::string::string((string *)&temp,(string *)pvVar4);
    textRecLength._M_dataplus._M_p = (pointer)&textRecLength.field_2;
    textRecLength._M_string_length = 0;
    textRecLength.field_2._M_local_buf[0] = '\0';
    pvVar4 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(this_01,__n);
    std::__cxx11::string::string((string *)&textRec,(string *)pvVar4);
    while (uVar9 = __n + 1, textRec._M_string_length < 0x3c) {
      sVar3 = std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(this_01);
      if (sVar3 <= uVar9) break;
      pvVar5 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::at(this_00,uVar9);
      vVar2 = *pvVar5;
      pvVar5 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::at(this_00,__n);
      if (4 < vVar2 - *pvVar5) break;
      pvVar4 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(this_01,uVar9);
      if (0x3c < textRec._M_string_length + pvVar4->_M_string_length) break;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at(this_01,uVar9);
      __n = __n + 1;
      std::__cxx11::string::append((string *)&textRec);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ofs);
    *(uint *)((long)auStack_248 + *(long *)(local_260._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_248 + *(long *)(local_260._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_260);
    std::operator>>((istream *)&ofs,(string *)&textRecLength);
    while (textRecLength._M_string_length < 2) {
      std::operator+(&local_50,"0",&textRecLength);
      std::__cxx11::string::operator=((string *)&textRecLength,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::operator+(&local_2e0,"T",&temp);
    std::operator+(&local_70,&local_2e0,&textRecLength);
    std::operator+(&local_50,&local_70,&textRec);
    std::__cxx11::string::operator=((string *)&textRec,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&textRecords,&textRec);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ofs);
    std::__cxx11::string::~string((string *)&textRec);
    std::__cxx11::string::~string((string *)&textRecLength);
    std::__cxx11::string::~string((string *)&temp);
  } while( true );
}

Assistant:

void Pass2::writeObjectProgram(std::string& progName,std::string& progLength) {
        std::string objProgPath = srcFileName + ".objprog";

        std::string headerRecord;
        std::deque<std::string> textRecords;
        std::deque<std::string> modRecords;
        std::string endRecord;

        headerRecord = "H" + progName;
        while(headerRecord.length() < 7)
            headerRecord += " ";

        std::deque<std::string> coAdd; //bta3tna elly hanshta8l 3leha
        for (int i = 0; i < correspondingAddresses.size(); ++i) {

            //DEBUG:
                    //std::cout << "Address bta3 " << i << " howa " << correspondingAddresses[i] << std::endl;

            std::stringstream ss;
            std::string temp = "";
            ss << std::hex << correspondingAddresses[i];
            ss >> temp;
            coAdd.push_back(temp);

            while(coAdd.at(i).length() < 6)
                coAdd.at(i) = "0" + coAdd.at(i);

        }

        headerRecord += coAdd.at(0);

        while(progLength.length() < 6)
            progLength = "0" + progLength;

        headerRecord += progLength; // now header record is done

        // now modification record era nya nya

        for (auto it : modificationAddresses) {

            std::string modRec = "";
            std::stringstream ss;
            ss << std::hex << it + 1;
            ss >> modRec;


            while (modRec.length() < 6)
                modRec = "0" + modRec;

            modRec = "M" + modRec + "05";
            modRecords.push_back(modRec);
        }

        endRecord = "E" + coAdd.at(0);

        for (int i = 0; i < objectCode.size(); ++i) {

            std::string startAdd = coAdd.at(i);
            std::string textRecLength;
            std::string textRec = objectCode.at(i);
            ++i;

            while( (textRec.length() < 60) && (i < objectCode.size()) ){
                if((correspondingAddresses.at(i) - correspondingAddresses.at(i-1)) <= 4){
                    if (objectCode.at(i).length() + textRec.length() <= 60){
                        textRec += objectCode.at(i);
                        ++i;
                    } else{
                        break;
                    }
                } else {
                    break;
                }
            }

            std::stringstream ss;
            ss << std::hex << textRec.length()/2;
            ss >> textRecLength;

            while (textRecLength.length() < 2){
                textRecLength = "0" + textRecLength;
            }

            textRec = "T" + startAdd + textRecLength + textRec;
            textRecords.push_back(textRec);

            --i;
        }


        // writing to file

        std::ofstream ofs(objProgPath);
        if (!ofs)
            throw std::runtime_error(std::string("Cannot open file: ") + objProgPath);

        logDebug("Writing object program to " + objProgPath);
        ofs.setf(std::ios::left);

        ofs << headerRecord << std::endl;

        for(auto it : textRecords)
            ofs << it << std::endl;

        for(auto it : modRecords)
            ofs << it << std::endl;

        ofs << endRecord << std::endl;

        ofs.close();

    }